

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_dec.c
# Opt level: O0

WebPImageReader WebPGetImageReader(WebPInputFileFormat format)

{
  WebPInputFileFormat format_local;
  WebPImageReader local_8;
  
  switch(format) {
  case WEBP_PNG_FORMAT:
    local_8 = ReadPNG;
    break;
  case WEBP_JPEG_FORMAT:
    local_8 = ReadJPEG;
    break;
  case WEBP_TIFF_FORMAT:
    local_8 = ReadTIFF;
    break;
  case WEBP_WEBP_FORMAT:
    local_8 = ReadWebP;
    break;
  case WEBP_PNM_FORMAT:
    local_8 = ReadPNM;
    break;
  default:
    local_8 = FailReader;
  }
  return local_8;
}

Assistant:

WebPImageReader WebPGetImageReader(WebPInputFileFormat format) {
  switch (format) {
    case WEBP_PNG_FORMAT: return ReadPNG;
    case WEBP_JPEG_FORMAT: return ReadJPEG;
    case WEBP_TIFF_FORMAT: return ReadTIFF;
    case WEBP_WEBP_FORMAT: return ReadWebP;
    case WEBP_PNM_FORMAT: return ReadPNM;
    default: return FailReader;
  }
}